

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  FILE *__s;
  size_t __n;
  ostream *poVar3;
  uint *puVar4;
  int err;
  int err_00;
  byte bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  string cmd;
  string logmailer;
  long local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_32;
  allocator<char> local_31;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    if (use_logging) {
      if (SendEmailInternal::vlocal__.level == (int32 *)0x0) {
        bVar1 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                            ,1);
        if (bVar1) goto LAB_001230de;
      }
      else if (0 < *SendEmailInternal::vlocal__.level) {
LAB_001230de:
        LogMessage::LogMessage
                  ((LogMessage *)((long)&cmd.field_2 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x869);
        poVar3 = std::operator<<((ostream *)(logmailer._M_dataplus._M_p + 0x7538),
                                 "Trying to send TITLE:");
        poVar3 = std::operator<<(poVar3,subject);
        poVar3 = std::operator<<(poVar3," BODY:");
        poVar3 = std::operator<<(poVar3,body);
        poVar3 = std::operator<<(poVar3," to ");
        std::operator<<(poVar3,dest);
        LogMessage::~LogMessage((LogMessage *)((long)&cmd.field_2 + 8));
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,body,dest);
    }
    std::__cxx11::string::string
              ((string *)(cmd.field_2._M_local_buf + 8),fLS::FLAGS_logmailer_abi_cxx11_);
    if (logmailer._M_dataplus._M_p == (pointer)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cmd.field_2 + 8),"/bin/mail");
    }
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cmd.field_2 + 8)," -s");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,subject,&local_32);
    ShellEscape(&local_138,&local_118);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&logmailer.field_2 + 8),&local_158,&local_138);
    std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&logmailer.field_2 + 8)," ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,dest,&local_31);
    ShellEscape(&local_f8,&local_d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   &local_58,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(logmailer.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_158);
    if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level == (int32 *)0x0)
    {
      bVar1 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                          &fLI::FLAGS_v,
                          "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                          ,4);
      if (bVar1) goto LAB_001232b6;
    }
    else if (3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level) {
LAB_001232b6:
      LogMessage::LogMessage
                ((LogMessage *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x877);
      poVar3 = std::operator<<((ostream *)(local_58._M_string_length + 0x7538),"Mailing command: ");
      std::operator<<(poVar3,(string *)local_b8);
      LogMessage::~LogMessage((LogMessage *)&local_58);
    }
    __s = popen((char *)local_b8,"w");
    if (__s == (FILE *)0x0) {
      if (use_logging) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x88b,2);
        poVar3 = std::operator<<((ostream *)(local_58._M_string_length + 0x7538),
                                 "Unable to send mail to ");
        std::operator<<(poVar3,dest);
        LogMessage::~LogMessage((LogMessage *)&local_58);
      }
      else {
        fprintf(_stderr,"Unable to send mail to %s\n",dest);
      }
    }
    else {
      if (body != (char *)0x0) {
        __n = strlen(body);
        fwrite(body,1,__n,__s);
      }
      iVar2 = pclose(__s);
      __stream = _stderr;
      body = (char *)0x1;
      if (iVar2 == -1) {
        if (use_logging) {
          LogMessage::LogMessage
                    ((LogMessage *)((long)&logmailer.field_2 + 8),
                     "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                     ,0x881,2);
          poVar3 = std::operator<<((ostream *)(local_70 + 0x7538),"Problems sending mail to ");
          poVar3 = std::operator<<(poVar3,dest);
          poVar3 = std::operator<<(poVar3,": ");
          puVar4 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_58,(google *)(ulong)*puVar4,err);
          std::operator<<(poVar3,(string *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          LogMessage::~LogMessage((LogMessage *)((long)&logmailer.field_2 + 8));
          body = (char *)0x0;
        }
        else {
          puVar4 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_58,(google *)(ulong)*puVar4,err_00);
          body = (char *)0x0;
          fprintf(__stream,"Problems sending mail to %s: %s\n",dest,local_58._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
    }
    bVar5 = (byte)body;
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
    if (__s != (FILE *)0x0) goto LAB_00123439;
  }
  bVar5 = 0;
LAB_00123439:
  return (bool)(bVar5 & 1);
}

Assistant:

static bool SendEmailInternal(const char*dest, const char *subject,
                              const char*body, bool use_logging) {
#ifndef __EMSCRIPTEN__
  if (dest && *dest) {
    if ( use_logging ) {
      VLOG(1) << "Trying to send TITLE:" << subject
              << " BODY:" << body << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n",
              subject, body, dest);
    }

    string logmailer = FLAGS_logmailer;
    if (logmailer.empty()) {
        logmailer = "/bin/mail";
    }
    string cmd =
        logmailer + " -s" +
        ShellEscape(subject) + " " + ShellEscape(dest);
    VLOG(4) << "Mailing command: " << cmd;

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != NULL) {
      // Add the body if we have one
      if (body)
        fwrite(body, sizeof(char), strlen(body), pipe);
      bool ok = pclose(pipe) != -1;
      if ( !ok ) {
        if ( use_logging ) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n",
                  dest, StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if ( use_logging ) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
#endif
  return false;
}